

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginElemSegment
          (BinaryReaderIR *this,Index index,Index table_index,uint8_t flags)

{
  undefined8 uVar1;
  uint uVar2;
  pointer *__ptr;
  undefined1 local_a8 [48];
  Var local_78;
  
  GetLocation(&local_78.loc,this);
  std::make_unique<wabt::ElemSegmentModuleField,wabt::Location>((Location *)local_a8);
  uVar1 = local_a8._0_8_;
  GetLocation((Location *)(local_a8 + 0x10),this);
  Var::Var(&local_78,table_index,(Location *)(local_a8 + 0x10));
  Var::operator=((Var *)(uVar1 + 0x68),&local_78);
  Var::~Var(&local_78);
  uVar2 = 2;
  if ((~(uint)flags & 3) != 0) {
    uVar2 = flags & 1;
  }
  *(uint *)(uVar1 + 0x40) = uVar2;
  local_a8._8_8_ = local_a8._0_8_;
  local_a8._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                       *)(local_a8 + 8));
  if ((long *)local_a8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._8_8_ + 8))();
  }
  local_a8._8_8_ = (char *)0x0;
  if ((long *)local_a8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginElemSegment(Index index,
                                        Index table_index,
                                        uint8_t flags) {
  auto field = std::make_unique<ElemSegmentModuleField>(GetLocation());
  ElemSegment& elem_segment = field->elem_segment;
  elem_segment.table_var = Var(table_index, GetLocation());
  if ((flags & SegDeclared) == SegDeclared) {
    elem_segment.kind = SegmentKind::Declared;
  } else if ((flags & SegPassive) == SegPassive) {
    elem_segment.kind = SegmentKind::Passive;
  } else {
    elem_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}